

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall libcellml::Component::removeVariable(Component *this,size_t index)

{
  ComponentImpl *pCVar1;
  size_type sVar2;
  reference pvVar3;
  ComponentImpl *pCVar4;
  element_type *this_00;
  VariableImpl *this_01;
  __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_58;
  __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_30 [8];
  value_type variable;
  size_t index_local;
  Component *this_local;
  
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)index;
  pCVar1 = pFunc(this);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
          ::size(&pCVar1->mVariables);
  if (index < sVar2) {
    pCVar1 = pFunc(this);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             ::operator[](&pCVar1->mVariables,
                          (size_type)
                          variable.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
    std::shared_ptr<libcellml::Variable>::shared_ptr
              ((shared_ptr<libcellml::Variable> *)local_30,pvVar3);
    pCVar1 = pFunc(this);
    pCVar4 = pFunc(this);
    local_58._M_current =
         (shared_ptr<libcellml::Variable> *)
         std::
         vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
         ::begin(&pCVar4->mVariables);
    local_50 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
               ::operator+(&local_58,
                           (difference_type)
                           variable.
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Variable>const*,std::vector<std::shared_ptr<libcellml::Variable>,std::allocator<std::shared_ptr<libcellml::Variable>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Variable>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Variable>const*,std::vector<std::shared_ptr<libcellml::Variable>,std::allocator<std::shared_ptr<libcellml::Variable>>>>
                *)&local_48,&local_50);
    std::
    vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
    ::erase(&pCVar1->mVariables,local_48);
    this_00 = std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
    this_01 = Variable::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
    std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  }
  return index < sVar2;
}

Assistant:

bool Component::removeVariable(size_t index)
{
    if (index < pFunc()->mVariables.size()) {
        auto variable = pFunc()->mVariables[index];
        pFunc()->mVariables.erase(pFunc()->mVariables.begin() + ptrdiff_t(index));
        variable->pFunc()->removeParent();
        return true;
    }

    return false;
}